

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestHG.cxx
# Opt level: O2

void __thiscall cmCTestHG::LogParser::EndElement(LogParser *this,string *name)

{
  pointer pCVar1;
  bool bVar2;
  long lVar3;
  pointer pcVar4;
  string *psVar5;
  string *path;
  pointer pbVar6;
  Change *change;
  pointer pCVar7;
  string added_paths;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  paths;
  undefined1 local_70 [8];
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  bVar2 = std::operator==(name,"logentry");
  if (bVar2) {
    (*(this->HG->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[9])
              (this->HG,&this->Rev,&this->Changes);
  }
  else if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start !=
           (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_finish) {
    bVar2 = std::operator==(name,"author");
    pcVar4 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (bVar2) {
      psVar5 = &(this->Rev).Author;
    }
    else {
      if (pcVar4 == (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish) goto LAB_001bf89d;
      bVar2 = std::operator==(name,"email");
      pcVar4 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (bVar2) {
        psVar5 = &(this->Rev).EMail;
      }
      else {
        if (pcVar4 == (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish) goto LAB_001bf89d;
        bVar2 = std::operator==(name,"date");
        pcVar4 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_start;
        if (bVar2) {
          psVar5 = &(this->Rev).Date;
        }
        else {
          if (pcVar4 == (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_finish) goto LAB_001bf89d;
          bVar2 = std::operator==(name,"msg");
          pcVar4 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (!bVar2) {
            if (pcVar4 != (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_finish) {
              bVar2 = std::operator==(name,"files");
              if (bVar2) {
                SplitCData_abi_cxx11_(&local_48,this);
                for (pbVar6 = local_48.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start;
                    pbVar6 != local_48.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish; pbVar6 = pbVar6 + 1) {
                  local_70[0] = 'U';
                  local_68._M_p = (pointer)&local_58;
                  local_60 = 0;
                  local_58._M_local_buf[0] = '\0';
                  cmCTestGlobalVC::Change::operator=(&this->CurChange,(Change *)local_70);
                  std::__cxx11::string::~string((string *)&local_68);
                  std::__cxx11::string::_M_assign((string *)&(this->CurChange).Path);
                  std::vector<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>::
                  push_back(&this->Changes,&this->CurChange);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~vector(&local_48);
              }
              else if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_start !=
                       (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                       super__Vector_impl_data._M_finish) {
                bVar2 = std::operator==(name,"file_adds");
                if (bVar2) {
                  local_70 = (undefined1  [8])&local_60;
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                            ((string *)local_70);
                  pCVar1 = (this->Changes).
                           super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (pCVar7 = (this->Changes).
                                super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                                ._M_impl.super__Vector_impl_data._M_start; pCVar7 != pCVar1;
                      pCVar7 = pCVar7 + 1) {
                    lVar3 = std::__cxx11::string::find((string *)local_70,(ulong)&pCVar7->Path);
                    if (lVar3 != -1) {
                      pCVar7->Action = 'A';
                    }
                  }
                }
                else {
                  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start ==
                      (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_finish) goto LAB_001bf89d;
                  bVar2 = std::operator==(name,"file_dels");
                  if (!bVar2) goto LAB_001bf89d;
                  local_70 = (undefined1  [8])&local_60;
                  std::__cxx11::string::
                  _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                            ((string *)local_70,
                             (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_start,
                             (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                             super__Vector_impl_data._M_finish);
                  pCVar1 = (this->Changes).
                           super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                  for (pCVar7 = (this->Changes).
                                super__Vector_base<cmCTestGlobalVC::Change,_std::allocator<cmCTestGlobalVC::Change>_>
                                ._M_impl.super__Vector_impl_data._M_start; pCVar7 != pCVar1;
                      pCVar7 = pCVar7 + 1) {
                    lVar3 = std::__cxx11::string::find((string *)local_70,(ulong)&pCVar7->Path);
                    if (lVar3 != -1) {
                      pCVar7->Action = 'D';
                    }
                  }
                }
                std::__cxx11::string::~string((string *)local_70);
              }
            }
            goto LAB_001bf89d;
          }
          psVar5 = &(this->Rev).Log;
        }
      }
    }
    std::__cxx11::string::assign((char *)psVar5,(ulong)pcVar4);
  }
LAB_001bf89d:
  pcVar4 = (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
      _M_finish != pcVar4) {
    (this->CData).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
    _M_finish = pcVar4;
  }
  return;
}

Assistant:

void EndElement(const std::string& name) override
  {
    if (name == "logentry") {
      this->HG->DoRevision(this->Rev, this->Changes);
    } else if (!this->CData.empty() && name == "author") {
      this->Rev.Author.assign(this->CData.data(), this->CData.size());
    } else if (!this->CData.empty() && name == "email") {
      this->Rev.EMail.assign(this->CData.data(), this->CData.size());
    } else if (!this->CData.empty() && name == "date") {
      this->Rev.Date.assign(this->CData.data(), this->CData.size());
    } else if (!this->CData.empty() && name == "msg") {
      this->Rev.Log.assign(this->CData.data(), this->CData.size());
    } else if (!this->CData.empty() && name == "files") {
      std::vector<std::string> paths = this->SplitCData();
      for (std::string const& path : paths) {
        // Updated by default, will be modified using file_adds and
        // file_dels.
        this->CurChange = Change('U');
        this->CurChange.Path = path;
        this->Changes.push_back(this->CurChange);
      }
    } else if (!this->CData.empty() && name == "file_adds") {
      std::string added_paths(this->CData.begin(), this->CData.end());
      for (Change& change : this->Changes) {
        if (added_paths.find(change.Path) != std::string::npos) {
          change.Action = 'A';
        }
      }
    } else if (!this->CData.empty() && name == "file_dels") {
      std::string added_paths(this->CData.begin(), this->CData.end());
      for (Change& change : this->Changes) {
        if (added_paths.find(change.Path) != std::string::npos) {
          change.Action = 'D';
        }
      }
    }
    this->CData.clear();
  }